

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.cpp
# Opt level: O0

void s_recv_padding(socket_t *socket,string_view trace)

{
  string_view trace_00;
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_RDX;
  size_t in_RSI;
  socket_t *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> resp;
  char *__lhs;
  char local_89 [9];
  allocator<char> *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string local_68 [48];
  string local_38 [32];
  
  trace_00._M_str = in_RDX;
  trace_00._M_len = in_RSI;
  s_recv<std::__cxx11::string>(in_RDI,trace_00);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    __lhs = local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+(__lhs,__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_68);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void s_recv_padding(zmq::socket_t *socket, std::string_view trace) {
    auto resp{s_recv<std::string>(socket, trace)};
    if (!resp.empty()) {
        throw std::runtime_error("Expected zero-sized frame:" +
                                 std::string(trace));
    }
}